

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

void cf_socket_close(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  connectdata *conn;
  byte bVar3;
  curl_socket_t sock;
  
  pvVar1 = cf->ctx;
  if (pvVar1 != (void *)0x0) {
    sock = *(int *)((long)pvVar1 + 0x98);
    if (sock != -1) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"cf_socket_close, fd=%d");
        sock = *(int *)((long)pvVar1 + 0x98);
      }
      conn = cf->conn;
      if (sock == conn->sock[cf->sockindex]) {
        conn->sock[cf->sockindex] = -1;
        sock = *(curl_socket_t *)((long)pvVar1 + 0x98);
      }
      socket_close(data,conn,(uint)((*(byte *)((long)pvVar1 + 0x134) & 4) == 0),sock);
      *(undefined4 *)((long)pvVar1 + 0x98) = 0xffffffff;
      bVar3 = *(byte *)((long)pvVar1 + 0x134);
      if (((bVar3 & 0x10) != 0) && (cf->sockindex == 0)) {
        cf->conn->remote_addr = (Curl_sockaddr_ex *)0x0;
        bVar3 = *(byte *)((long)pvVar1 + 0x134);
      }
      *(byte *)((long)pvVar1 + 0x134) = bVar3 & 0xef;
      *(undefined8 *)((long)pvVar1 + 0x100) = 0;
      *(undefined8 *)((long)pvVar1 + 0x108) = 0;
      *(undefined8 *)((long)pvVar1 + 0x110) = 0;
      *(undefined8 *)((long)pvVar1 + 0x118) = 0;
    }
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  return;
}

Assistant:

static void cf_socket_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx && CURL_SOCKET_BAD != ctx->sock) {
    CURL_TRC_CF(data, cf, "cf_socket_close, fd=%" FMT_SOCKET_T, ctx->sock);
    if(ctx->sock == cf->conn->sock[cf->sockindex])
      cf->conn->sock[cf->sockindex] = CURL_SOCKET_BAD;
    socket_close(data, cf->conn, !ctx->accepted, ctx->sock);
    ctx->sock = CURL_SOCKET_BAD;
    if(ctx->active && cf->sockindex == FIRSTSOCKET)
      cf->conn->remote_addr = NULL;
    ctx->active = FALSE;
    memset(&ctx->started_at, 0, sizeof(ctx->started_at));
    memset(&ctx->connected_at, 0, sizeof(ctx->connected_at));
  }

  cf->connected = FALSE;
}